

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void __thiscall
absl::lts_20250127::container_internal::HashSetResizeHelper::
GrowSizeIntoSingleGroup<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
          (HashSetResizeHelper *this,CommonFields *c,
          allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *alloc_ref)

{
  ctrl_t *pcVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined8 *puVar5;
  ulong uVar6;
  
  uVar4 = this->old_capacity_;
  if (7 < uVar4) {
    __assert_fail("(old_capacity_ < Group::kWidth / 2) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x856,
                  "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, std::basic_string<char>>>, Alloc = std::allocator<std::pair<const std::basic_string_view<char>, std::basic_string<char>>>]"
                 );
  }
  if ((c->capacity_ < 0x11) && (uVar4 < c->capacity_)) {
    if (this->was_soo_ != true) {
      if (uVar4 != 0) {
        pcVar1 = (this->old_heap_or_soo_).heap.control;
        puVar3 = (undefined8 *)((long)(this->old_heap_or_soo_).heap.slot_array.p + 0x20);
        puVar5 = (undefined8 *)((long)(c->heap_or_soo_).heap.slot_array.p + 0x50);
        uVar6 = 0;
        do {
          if (kSentinel < pcVar1[uVar6]) {
            uVar2 = puVar3[-3];
            puVar5[-4] = puVar3[-4];
            puVar5[-3] = uVar2;
            puVar5[-2] = puVar5;
            if (puVar3 == (undefined8 *)puVar3[-2]) {
              uVar2 = puVar3[1];
              *puVar5 = *puVar3;
              puVar5[1] = uVar2;
            }
            else {
              puVar5[-2] = (undefined8 *)puVar3[-2];
              *puVar5 = *puVar3;
            }
            puVar5[-1] = puVar3[-1];
            puVar3[-2] = puVar3;
            puVar3[-1] = 0;
            *(undefined1 *)puVar3 = 0;
            uVar4 = this->old_capacity_;
          }
          uVar6 = uVar6 + 1;
          puVar3 = puVar3 + 6;
          puVar5 = puVar5 + 6;
        } while (uVar6 < uVar4);
      }
      return;
    }
    __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x7ea,"void *absl::container_internal::HashSetResizeHelper::old_slots() const");
  }
  __assert_fail("(IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity())) && \"Try enabling sanitizers.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x858,
                "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, std::basic_string<char>>>, Alloc = std::allocator<std::pair<const std::basic_string_view<char>, std::basic_string<char>>>]"
               );
}

Assistant:

void GrowSizeIntoSingleGroup(CommonFields& c, Alloc& alloc_ref) {
    ABSL_SWISSTABLE_ASSERT(old_capacity_ < Group::kWidth / 2);
    ABSL_SWISSTABLE_ASSERT(
        IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity()));
    using slot_type = typename PolicyTraits::slot_type;
    ABSL_SWISSTABLE_ASSERT(is_single_group(c.capacity()));

    auto* new_slots = static_cast<slot_type*>(c.slot_array()) + 1;
    auto* old_slots_ptr = static_cast<slot_type*>(old_slots());
    auto* old_ctrl_ptr = old_ctrl();

    for (size_t i = 0; i < old_capacity_; ++i, ++new_slots) {
      if (IsFull(old_ctrl_ptr[i])) {
        SanitizerUnpoisonMemoryRegion(new_slots, sizeof(slot_type));
        PolicyTraits::transfer(&alloc_ref, new_slots, old_slots_ptr + i);
      }
    }
    PoisonSingleGroupEmptySlots(c, sizeof(slot_type));
  }